

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,uint resX,uint resY)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  QuadMeshNode *pQVar6;
  ulong uVar7;
  long local_70;
  long *local_68;
  Ref<embree::SceneGraph::Node> *local_60;
  Node *local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::QuadMeshNode> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar2 == (long *)0x0) {
    local_60 = node;
    if (node->ptr == (Node *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_58 = (Node *)this;
    if (plVar3 == (long *)0x0) {
      if (local_60->ptr == (Node *)0x0) {
        plVar4 = (long *)0x0;
      }
      else {
        plVar4 = (long *)__dynamic_cast(local_60->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_68 = plVar3;
      if (plVar4 == (long *)0x0) {
        if (local_60->ptr == (Node *)0x0) {
          pQVar6 = (QuadMeshNode *)0x0;
        }
        else {
          pQVar6 = (QuadMeshNode *)
                   __dynamic_cast(local_60->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        if (pQVar6 != (QuadMeshNode *)0x0) {
          (*(pQVar6->super_Node).super_RefCount._vptr_RefCount[2])(pQVar6);
          local_38.ptr = pQVar6;
          (*(pQVar6->super_Node).super_RefCount._vptr_RefCount[2])(pQVar6);
          convert_quads_to_grids((SceneGraph *)local_58,&local_38,resX,resY);
          (*(pQVar6->super_Node).super_RefCount._vptr_RefCount[3])(pQVar6);
          plVar3 = local_68;
          (*(pQVar6->super_Node).super_RefCount._vptr_RefCount[3])();
          if (plVar3 == (long *)0x0) {
            bVar1 = false;
            node = local_60;
            this = (SceneGraph *)local_58;
          }
          else {
            (**(code **)(*plVar3 + 0x18))(plVar3);
            bVar1 = false;
            node = local_60;
            this = (SceneGraph *)local_58;
          }
          goto LAB_001529b3;
        }
      }
      else {
        (**(code **)(*plVar4 + 0x10))(plVar4);
        lVar5 = plVar4[0xd];
        if (plVar4[0xe] != lVar5) {
          uVar7 = 0;
          do {
            local_50.ptr = *(Node **)(lVar5 + uVar7 * 8);
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_quads_to_grids((SceneGraph *)&local_70,&local_50,resX,resY);
            lVar5 = plVar4[0xd];
            plVar3 = *(long **)(lVar5 + uVar7 * 8);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 0x18))();
            }
            *(long *)(lVar5 + uVar7 * 8) = local_70;
            local_70 = 0;
            if (local_50.ptr != (Node *)0x0) {
              (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar7 = uVar7 + 1;
            lVar5 = plVar4[0xd];
          } while (uVar7 < (ulong)(plVar4[0xe] - lVar5 >> 3));
        }
      }
      plVar3 = local_68;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      local_48.ptr = (Node *)plVar3[0x10];
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_quads_to_grids((SceneGraph *)&local_70,&local_48,resX,resY);
      if ((long *)plVar3[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar3[0x10] + 0x18))();
      }
      plVar3[0x10] = local_70;
      local_70 = 0;
      if (local_48.ptr != (Node *)0x0) {
        (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar1 = true;
    node = local_60;
    this = (SceneGraph *)local_58;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
      node = local_60;
      this = (SceneGraph *)local_58;
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2);
    local_40.ptr = (Node *)plVar2[0x13];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_quads_to_grids((SceneGraph *)&local_70,&local_40,resX,resY);
    if ((long *)plVar2[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar2[0x13] + 0x18))();
    }
    plVar2[0x13] = local_70;
    local_70 = 0;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar1 = true;
  }
LAB_001529b3:
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))(plVar2);
  }
  if (bVar1) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids(Ref<SceneGraph::Node> node, const unsigned int resX, const unsigned int resY )
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_grids(groupNode->children[i], resX, resY);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      return convert_quads_to_grids(qmesh, resX, resY);
    }
    return node;
  }